

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O2

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool_virt(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                *this,bool *value)

{
  uint32_t uVar1;
  
  uVar1 = TCompactProtocolT<duckdb::DecryptionTransport>::readBool
                    ((TCompactProtocolT<duckdb::DecryptionTransport> *)this,value);
  return uVar1;
}

Assistant:

uint32_t readBool_virt(bool& value) override {
    return static_cast<Protocol_*>(this)->readBool(value);
  }